

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrLDA0xb1(CPU *this)

{
  uint8_t argument;
  
  argument = indirect_indexed_addr(this);
  LDA(this,argument);
  return 5;
}

Assistant:

int CPU::instrLDA0xb1() {
	LDA(indirect_indexed_addr());
	return 5;
}